

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O2

void __thiscall
QNativeSocketEnginePrivate::~QNativeSocketEnginePrivate(QNativeSocketEnginePrivate *this)

{
  QAbstractSocketEnginePrivate::~QAbstractSocketEnginePrivate
            (&this->super_QAbstractSocketEnginePrivate);
  operator_delete(this,0xf8);
  return;
}

Assistant:

QNativeSocketEnginePrivate::~QNativeSocketEnginePrivate()
{
}